

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O1

void scale16(pced *out,int pow,int x)

{
  limb_t lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  limb_t lVar6;
  uint uVar7;
  long lVar8;
  limb_t lVar9;
  long lVar10;
  bool bVar11;
  pced R;
  
  R.prod[2] = 0;
  R.prod[3] = 0;
  R.prod[0] = 0;
  R.prod[1] = 0;
  R.sum[3] = 0;
  R.sum[4] = 0;
  R.sum[1] = 0;
  R.sum[2] = 0;
  R.diff[4] = 0;
  R.sum[0] = 0;
  R.diff[2] = 0;
  R.diff[3] = 0;
  R.diff[0] = 0;
  R.diff[1] = 0;
  R.prod[4] = 0;
  iVar2 = 1 - ((uint)x >> 2 & 2);
  uVar3 = x * iVar2;
  uVar7 = (int)uVar3 >> 2 | uVar3;
  uVar4 = (ulong)((uVar7 >> 1 | uVar7) & 1) - 1;
  lVar8 = 0;
  do {
    R.diff[lVar8] = R.diff[lVar8] ^ pced_zero.diff[lVar8] & uVar4;
    R.sum[lVar8] = R.sum[lVar8] ^ pced_zero.sum[lVar8] & uVar4;
    R.prod[lVar8] = R.prod[lVar8] ^ pced_zero.prod[lVar8] & uVar4;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  lVar8 = (long)(pow >> 1) * 0x3c0 + 0x104390;
  lVar5 = 0;
  do {
    uVar3 = uVar3 - 1;
    uVar7 = (int)uVar3 >> 2 | uVar3;
    uVar4 = (ulong)((uVar7 >> 1 | uVar7) & 1) - 1;
    lVar10 = 0;
    do {
      R.diff[lVar10] = R.diff[lVar10] ^ *(ulong *)(lVar8 + -0x50 + lVar10 * 8) & uVar4;
      R.sum[lVar10] = R.sum[lVar10] ^ *(ulong *)(lVar8 + -0x28 + lVar10 * 8) & uVar4;
      R.prod[lVar10] = R.prod[lVar10] ^ *(ulong *)(lVar8 + lVar10 * 8) & uVar4;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    lVar5 = lVar5 + 1;
    lVar8 = lVar8 + 0x78;
  } while (lVar5 != 8);
  lVar8 = 0;
  do {
    lVar1 = R.diff[lVar8];
    lVar6 = R.sum[lVar8];
    bVar11 = ((uint)x >> 3 & 1) != 0;
    lVar9 = lVar1;
    if (bVar11) {
      lVar9 = lVar6;
    }
    out->diff[lVar8] = lVar9;
    if (bVar11) {
      lVar6 = lVar1;
    }
    out->sum[lVar8] = lVar6;
    out->prod[lVar8] = R.prod[lVar8] * (long)iVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  return;
}

Assistant:

static void
scale16(struct pced *out, int pow, int x)
{
	struct pced R = { { 0 }, { 0 }, { 0 } };
	limb_t mA, mB, mask;
	int neg, sgnx, absx;
	int i, k;
	
	neg = (x >> 3) & 1;
	sgnx = 1 - 2*neg;
	absx = sgnx * x;
	pow >>= 1;

	/* handle abs(x) == 0 */
	mask = absx | (absx >> 2);
	mask |= mask >> 1;
	mask = (mask & 1) - 1;
	for (i = 0; i < FLD_LIMB_NUM; i++) {
		R.diff[i] ^= pced_zero.diff[i] & mask;
		R.sum[i] ^= pced_zero.sum[i] & mask;
		R.prod[i] ^= pced_zero.prod[i] & mask;
	}


	/* go through our table and look for abs(x) */
	for (k = 0; k < 8; k++) {
		absx--;
		mask = absx | (absx >> 2);
		mask |= mask >> 1;
		mask = (mask & 1) - 1;
		for (i = 0; i < FLD_LIMB_NUM; i++) {
			R.diff[i] ^= ed_lookup[pow][k].diff[i] & mask;
			R.sum[i] ^= ed_lookup[pow][k].sum[i] & mask;
			R.prod[i] ^= ed_lookup[pow][k].prod[i] & mask;
		}
	}

	/* conditionally negate R and write to out */
	mA = neg-1;
	mB = ~mA;
	for (i = 0; i < FLD_LIMB_NUM; i++) {
		out->diff[i] = (mA & R.diff[i]) ^ (mB & R.sum[i]);
		out->sum[i]  = (mB & R.diff[i]) ^ (mA & R.sum[i]);
		out->prod[i] = sgnx * R.prod[i];
	}
}